

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O3

iterator __thiscall
GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::Splice
          (MI<6UL,_GF2::MOGrevlex<6UL>_> *this,MI<6UL,_GF2::MOGrevlex<6UL>_> *iRight,iterator pos)

{
  bool bVar1;
  _List_node_base **pp_Var2;
  __off64_t *in_R8;
  size_t in_R9;
  iterator iVar3;
  
  pp_Var2 = (_List_node_base **)&stack0xffffffffffffffd8;
  iVar3._M_node = (_List_node_base *)0x0;
  bVar1 = Find(this,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)(pos._M_node + 1),
               (iterator *)&stack0xffffffffffffffd8);
  if (bVar1) {
    std::__cxx11::
    list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>::
    _M_erase(&iRight->
              super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ,pos);
  }
  else {
    std::__cxx11::
    list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>::
    splice(&this->
            super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
           ,(int)iVar3._M_node,(__off64_t *)iRight,(int)pos._M_node,in_R8,in_R9,(int)iVar3._M_node);
    pp_Var2 = &(iVar3._M_node)->_M_prev;
  }
  return (iterator)*pp_Var2;
}

Assistant:

iterator Splice(MI& iRight, iterator pos)
	{
		assert(IsConsistent(iRight));
		iterator where;
		if (Find(*pos, where))
			iRight.RemoveAt(pos);
		else
			splice(where, iRight, pos), --where;
		return where;
	}